

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int allocateBtreePage(BtShared *pBt,MemPage **ppPage,Pgno *pPgno,Pgno nearby,u8 eMode)

{
  u8 uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  MemPage *pMVar6;
  u8 *puVar7;
  Bitvec *p;
  bool bVar8;
  MemPage *pMVar9;
  Pgno PVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  byte *pbVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  MemPage *pMVar18;
  uint uVar19;
  int iVar20;
  MemPage *pMVar21;
  uint uVar22;
  uint uVar23;
  long in_FS_OFFSET;
  bool bVar24;
  u8 eType;
  MemPage *pTrunk;
  uint local_64;
  MemPage *local_48;
  MemPage *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = (MemPage *)0x0;
  pMVar6 = pBt->pPage1;
  uVar19 = pBt->nPage;
  uVar22 = *(uint *)(pMVar6->aData + 0x24);
  uVar22 = uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 | uVar22 << 0x18;
  if (uVar22 < uVar19) {
    if (uVar22 == 0) {
      uVar1 = pBt->bDoTruncate;
      iVar11 = sqlite3PagerWrite(pMVar6->pDbPage);
      if (iVar11 == 0) {
        uVar22 = pBt->nPage;
        uVar19 = uVar22 + 1;
        pBt->nPage = uVar19;
        uVar15 = (uint)sqlite3PendingByte / pBt->pageSize;
        if (uVar22 == uVar15) {
          uVar19 = uVar22 + 2;
          pBt->nPage = uVar19;
        }
        uVar22 = (uint)(uVar1 == '\0');
        if (pBt->autoVacuum != '\0') {
          PVar10 = 0;
          if (1 < uVar19) {
            iVar11 = (uVar19 - 2) - (uVar19 - 2) % (pBt->usableSize / 5 + 1);
            PVar10 = iVar11 + (uint)(iVar11 + 1U == uVar15) + 2;
          }
          if (PVar10 == uVar19) {
            local_48 = (MemPage *)0x0;
            iVar11 = btreeGetUnusedPage(pBt,uVar19,&local_48,uVar22);
            pMVar6 = local_48;
            if (iVar11 != 0) goto LAB_001406e7;
            iVar11 = sqlite3PagerWrite(local_48->pDbPage);
            sqlite3PagerUnrefNotNull(pMVar6->pDbPage);
            if (iVar11 != 0) goto LAB_001406e7;
            uVar15 = pBt->nPage;
            uVar19 = uVar15 + 1;
            pBt->nPage = uVar19;
            if (uVar15 == (uint)sqlite3PendingByte / pBt->pageSize) {
              uVar19 = uVar15 + 2;
              pBt->nPage = uVar19;
            }
          }
        }
        *(uint *)(pBt->pPage1->aData + 0x1c) =
             uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 | uVar19 << 0x18;
        PVar10 = pBt->nPage;
        *pPgno = PVar10;
        iVar11 = btreeGetUnusedPage(pBt,PVar10,ppPage,uVar22);
        if (iVar11 == 0) {
          iVar11 = sqlite3PagerWrite((*ppPage)->pDbPage);
          if (iVar11 == 0) {
            iVar11 = 0;
          }
          else {
            if (*ppPage != (MemPage *)0x0) {
              sqlite3PagerUnrefNotNull((*ppPage)->pDbPage);
            }
            *ppPage = (MemPage *)0x0;
          }
        }
      }
    }
    else {
      if (eMode == '\x02') {
        bVar24 = true;
      }
      else if ((eMode == '\x01') && (nearby <= uVar19)) {
        local_48 = (MemPage *)CONCAT71(local_48._1_7_,0xaa);
        iVar11 = ptrmapGet(pBt,nearby,(u8 *)&local_48,(Pgno *)0x0);
        bVar24 = (char)local_48 == '\x02';
        if (iVar11 != 0) goto LAB_001406e7;
      }
      else {
        bVar24 = false;
      }
      iVar11 = sqlite3PagerWrite(pMVar6->pDbPage);
      if (iVar11 == 0) {
        uVar15 = uVar22 - 1;
        *(uint *)(pMVar6->aData + 0x24) =
             uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 * 0x1000000
        ;
        local_64 = 0;
        pMVar18 = (MemPage *)0x0;
        do {
          if (pMVar18 == (MemPage *)0x0) {
            puVar7 = pMVar6->aData;
            uVar15 = (uint)puVar7[0x22] << 8 |
                     (uint)puVar7[0x21] << 0x10 | (uint)puVar7[0x20] << 0x18;
            pbVar14 = puVar7 + 0x23;
          }
          else {
            pbVar14 = pMVar18->aData;
            uVar15 = (uint)pbVar14[2] << 8 | (uint)pbVar14[1] << 0x10 | (uint)*pbVar14 << 0x18;
            pbVar14 = pbVar14 + 3;
          }
          uVar15 = *pbVar14 | uVar15;
          if ((uVar19 < uVar15) || (uVar22 < local_64)) {
            iVar11 = 0xb;
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12def,
                        "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
LAB_00140cbe:
            local_40 = (MemPage *)0x0;
            goto LAB_00140db1;
          }
          iVar11 = btreeGetUnusedPage(pBt,uVar15,&local_40,0);
          pMVar21 = local_40;
          if (iVar11 != 0) goto LAB_00140cbe;
          puVar7 = local_40->aData;
          uVar23 = *(uint *)(puVar7 + 4);
          uVar23 = uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 |
                   uVar23 << 0x18;
          if ((bVar24) || (uVar23 != 0)) {
            if ((pBt->usableSize >> 2) - 2 < uVar23) {
              iVar11 = 0xb;
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12e0c,
                          "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
              goto LAB_00140da8;
            }
            if (bVar24) {
              if ((uVar15 == nearby) || (eMode == '\x02' && uVar15 < nearby)) {
                *pPgno = uVar15;
                *ppPage = local_40;
                iVar11 = sqlite3PagerWrite(local_40->pDbPage);
                if (iVar11 != 0) goto LAB_00140da8;
                if (uVar23 == 0) {
                  if (pMVar18 == (MemPage *)0x0) {
                    *(undefined4 *)(pMVar6->aData + 0x20) = *(undefined4 *)pMVar21->aData;
                  }
                  else {
                    iVar11 = sqlite3PagerWrite(pMVar18->pDbPage);
                    if (iVar11 != 0) goto LAB_00140da8;
                    *(undefined4 *)pMVar18->aData = *(undefined4 *)pMVar21->aData;
                  }
                }
                else {
                  local_48 = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
                  puVar7 = pMVar21->aData;
                  bVar2 = puVar7[8];
                  bVar3 = puVar7[9];
                  bVar4 = puVar7[10];
                  bVar5 = puVar7[0xb];
                  uVar15 = (uint)bVar4 << 8 | (uint)bVar3 << 0x10 | (uint)bVar2 << 0x18 |
                           (uint)bVar5;
                  if (uVar19 < uVar15) {
                    iVar11 = 0xb;
                    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12e2e,
                                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
                    goto LAB_00140da8;
                  }
                  iVar11 = btreeGetUnusedPage(pBt,uVar15,&local_48,0);
                  pMVar9 = local_48;
                  if (iVar11 != 0) goto LAB_00140da8;
                  iVar11 = sqlite3PagerWrite(local_48->pDbPage);
                  if (iVar11 != 0) {
                    sqlite3PagerUnrefNotNull(pMVar9->pDbPage);
                    goto LAB_00140da8;
                  }
                  *(undefined4 *)pMVar9->aData = *(undefined4 *)pMVar21->aData;
                  uVar15 = uVar23 - 1;
                  *(uint *)(pMVar9->aData + 4) =
                       uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                       uVar15 * 0x1000000;
                  memcpy(pMVar9->aData + 8,pMVar21->aData + 0xc,(ulong)(uVar23 * 4 - 4));
                  sqlite3PagerUnrefNotNull(pMVar9->pDbPage);
                  if (pMVar18 == (MemPage *)0x0) {
                    puVar7 = pMVar6->aData;
                    puVar7[0x20] = bVar2;
                    puVar7[0x21] = bVar3;
                    puVar7[0x22] = bVar4;
                    pbVar14 = puVar7 + 0x23;
                  }
                  else {
                    iVar11 = sqlite3PagerWrite(pMVar18->pDbPage);
                    if (iVar11 != 0) goto LAB_00140da8;
                    pbVar14 = pMVar18->aData;
                    *pbVar14 = bVar2;
                    pbVar14[1] = bVar3;
                    pbVar14[2] = bVar4;
                    pbVar14 = pbVar14 + 3;
                  }
                  *pbVar14 = bVar5;
                }
                local_40 = (MemPage *)0x0;
                pMVar21 = (MemPage *)0x0;
                bVar8 = false;
                iVar11 = 0;
                goto LAB_00140c26;
              }
            }
            if (uVar23 != 0) {
              uVar15 = 0;
              if (nearby != 0) {
                uVar15 = 0;
                if (eMode == '\x02') {
                  uVar16 = 8;
                  uVar17 = 0;
                  do {
                    uVar12 = *(uint *)(puVar7 + uVar16);
                    if ((uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                        uVar12 << 0x18) <= nearby) {
                      uVar15 = (uint)uVar17;
                      break;
                    }
                    uVar17 = uVar17 + 1;
                    uVar16 = uVar16 + 4;
                  } while (uVar23 != uVar17);
                }
                else if (uVar23 != 1) {
                  uVar15 = *(uint *)(puVar7 + 8);
                  iVar13 = (uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                           uVar15 << 0x18) - nearby;
                  iVar11 = -iVar13;
                  if (-1 < iVar13) {
                    iVar11 = iVar13;
                  }
                  uVar15 = 0;
                  uVar17 = 1;
                  uVar16 = 0xc;
                  do {
                    uVar12 = *(uint *)(puVar7 + uVar16);
                    iVar20 = (uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                             uVar12 << 0x18) - nearby;
                    iVar13 = -iVar20;
                    if (-1 < iVar20) {
                      iVar13 = iVar20;
                    }
                    if (iVar13 < iVar11) {
                      uVar15 = (uint)uVar17;
                      iVar11 = iVar13;
                    }
                    uVar17 = uVar17 + 1;
                    uVar16 = uVar16 + 4;
                  } while (uVar23 != uVar17);
                }
              }
              uVar16 = uVar15 * 4 + 8;
              uVar12 = *(uint *)(puVar7 + uVar16);
              uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                       uVar12 << 0x18;
              if ((uVar19 < uVar12) || (uVar12 < 2)) {
                iVar11 = 0xb;
                sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12e6f,
                            "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
                goto LAB_00140c4f;
              }
              if (((uVar12 == nearby) || (eMode == '\x02' && uVar12 < nearby)) || (!bVar24)) {
                *pPgno = uVar12;
                iVar11 = sqlite3PagerWrite(local_40->pDbPage);
                if (iVar11 == 0) {
                  uVar12 = uVar23 - 1;
                  if (uVar15 < uVar12) {
                    *(undefined4 *)(puVar7 + uVar16) = *(undefined4 *)(puVar7 + (uVar23 * 4 + 4));
                  }
                  *(uint *)(puVar7 + 4) =
                       uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                       uVar12 * 0x1000000;
                  uVar15 = *pPgno;
                  p = pBt->pHasContent;
                  if (p == (Bitvec *)0x0) {
                    uVar23 = 1;
                  }
                  else {
                    uVar23 = 0;
                    if (uVar15 <= p->iSize) {
                      iVar11 = sqlite3BitvecTestNotNull(p,uVar15);
                      uVar23 = (uint)(iVar11 == 0);
                    }
                  }
                  iVar11 = btreeGetUnusedPage(pBt,uVar15,ppPage,uVar23);
                  if ((iVar11 == 0) &&
                     (iVar13 = sqlite3PagerWrite((*ppPage)->pDbPage), iVar11 = 0, iVar13 != 0)) {
                    if (*ppPage != (MemPage *)0x0) {
                      sqlite3PagerUnrefNotNull((*ppPage)->pDbPage);
                    }
                    *ppPage = (MemPage *)0x0;
                    iVar11 = iVar13;
                  }
                  bVar8 = false;
                  goto LAB_00140c26;
                }
                goto LAB_00140da8;
              }
              bVar24 = true;
            }
            iVar11 = 0;
            bVar8 = bVar24;
          }
          else {
            iVar11 = sqlite3PagerWrite(local_40->pDbPage);
            if (iVar11 != 0) goto LAB_00140da8;
            *pPgno = uVar15;
            *(undefined4 *)(pMVar6->aData + 0x20) = *(undefined4 *)pMVar21->aData;
            *ppPage = pMVar21;
            local_40 = (MemPage *)0x0;
            pMVar21 = (MemPage *)0x0;
            iVar11 = 0;
            bVar8 = false;
          }
LAB_00140c26:
          if (pMVar18 != (MemPage *)0x0) {
            sqlite3PagerUnrefNotNull(pMVar18->pDbPage);
          }
          local_64 = local_64 + 1;
          bVar24 = true;
          pMVar18 = pMVar21;
        } while (bVar8);
        pMVar18 = (MemPage *)0x0;
LAB_00140c4f:
        if (pMVar21 != (MemPage *)0x0) {
LAB_00140da8:
          sqlite3PagerUnrefNotNull(pMVar21->pDbPage);
        }
LAB_00140db1:
        if (pMVar18 != (MemPage *)0x0) {
          sqlite3PagerUnrefNotNull(pMVar18->pDbPage);
        }
      }
    }
  }
  else {
    iVar11 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12db7,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
  }
LAB_001406e7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar11;
}

Assistant:

static int allocateBtreePage(
  BtShared *pBt,         /* The btree */
  MemPage **ppPage,      /* Store pointer to the allocated page here */
  Pgno *pPgno,           /* Store the page number here */
  Pgno nearby,           /* Search for a page near this one */
  u8 eMode               /* BTALLOC_EXACT, BTALLOC_LT, or BTALLOC_ANY */
){
  MemPage *pPage1;
  int rc;
  u32 n;     /* Number of pages on the freelist */
  u32 k;     /* Number of leaves on the trunk of the freelist */
  MemPage *pTrunk = 0;
  MemPage *pPrevTrunk = 0;
  Pgno mxPage;     /* Total size of the database file */

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( eMode==BTALLOC_ANY || (nearby>0 && IfNotOmitAV(pBt->autoVacuum)) );
  pPage1 = pBt->pPage1;
  mxPage = btreePagecount(pBt);
  /* EVIDENCE-OF: R-21003-45125 The 4-byte big-endian integer at offset 36
  ** stores the total number of pages on the freelist. */
  n = get4byte(&pPage1->aData[36]);
  testcase( n==mxPage-1 );
  if( n>=mxPage ){
    return SQLITE_CORRUPT_BKPT;
  }
  if( n>0 ){
    /* There are pages on the freelist.  Reuse one of those pages. */
    Pgno iTrunk;
    u8 searchList = 0; /* If the free-list must be searched for 'nearby' */
    u32 nSearch = 0;   /* Count of the number of search attempts */

    /* If eMode==BTALLOC_EXACT and a query of the pointer-map
    ** shows that the page 'nearby' is somewhere on the free-list, then
    ** the entire-list will be searched for that page.
    */
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( eMode==BTALLOC_EXACT ){
      if( nearby<=mxPage ){
        u8 eType;
        assert( nearby>0 );
        assert( pBt->autoVacuum );
        rc = ptrmapGet(pBt, nearby, &eType, 0);
        if( rc ) return rc;
        if( eType==PTRMAP_FREEPAGE ){
          searchList = 1;
        }
      }
    }else if( eMode==BTALLOC_LE ){
      searchList = 1;
    }
#endif

    /* Decrement the free-list count by 1. Set iTrunk to the index of the
    ** first free-list trunk page. iPrevTrunk is initially 1.
    */
    rc = sqlite3PagerWrite(pPage1->pDbPage);
    if( rc ) return rc;
    put4byte(&pPage1->aData[36], n-1);

    /* The code within this loop is run only once if the 'searchList' variable
    ** is not true. Otherwise, it runs once for each trunk-page on the
    ** free-list until the page 'nearby' is located (eMode==BTALLOC_EXACT)
    ** or until a page less than 'nearby' is located (eMode==BTALLOC_LT)
    */
    do {
      pPrevTrunk = pTrunk;
      if( pPrevTrunk ){
        /* EVIDENCE-OF: R-01506-11053 The first integer on a freelist trunk page
        ** is the page number of the next freelist trunk page in the list or
        ** zero if this is the last freelist trunk page. */
        iTrunk = get4byte(&pPrevTrunk->aData[0]);
      }else{
        /* EVIDENCE-OF: R-59841-13798 The 4-byte big-endian integer at offset 32
        ** stores the page number of the first page of the freelist, or zero if
        ** the freelist is empty. */
        iTrunk = get4byte(&pPage1->aData[32]);
      }
      testcase( iTrunk==mxPage );
      if( iTrunk>mxPage || nSearch++ > n ){
        rc = SQLITE_CORRUPT_PGNO(pPrevTrunk ? pPrevTrunk->pgno : 1);
      }else{
        rc = btreeGetUnusedPage(pBt, iTrunk, &pTrunk, 0);
      }
      if( rc ){
        pTrunk = 0;
        goto end_allocate_page;
      }
      assert( pTrunk!=0 );
      assert( pTrunk->aData!=0 );
      /* EVIDENCE-OF: R-13523-04394 The second integer on a freelist trunk page
      ** is the number of leaf page pointers to follow. */
      k = get4byte(&pTrunk->aData[4]);
      if( k==0 && !searchList ){
        /* The trunk has no leaves and the list is not being searched.
        ** So extract the trunk page itself and use it as the newly
        ** allocated page */
        assert( pPrevTrunk==0 );
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        *pPgno = iTrunk;
        memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
        *ppPage = pTrunk;
        pTrunk = 0;
        TRACE(("ALLOCATE: %u trunk - %u free pages left\n", *pPgno, n-1));
      }else if( k>(u32)(pBt->usableSize/4 - 2) ){
        /* Value of k is out of range.  Database corruption */
        rc = SQLITE_CORRUPT_PGNO(iTrunk);
        goto end_allocate_page;
#ifndef SQLITE_OMIT_AUTOVACUUM
      }else if( searchList
            && (nearby==iTrunk || (iTrunk<nearby && eMode==BTALLOC_LE))
      ){
        /* The list is being searched and this trunk page is the page
        ** to allocate, regardless of whether it has leaves.
        */
        *pPgno = iTrunk;
        *ppPage = pTrunk;
        searchList = 0;
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        if( k==0 ){
          if( !pPrevTrunk ){
            memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc!=SQLITE_OK ){
              goto end_allocate_page;
            }
            memcpy(&pPrevTrunk->aData[0], &pTrunk->aData[0], 4);
          }
        }else{
          /* The trunk page is required by the caller but it contains
          ** pointers to free-list leaves. The first leaf becomes a trunk
          ** page in this case.
          */
          MemPage *pNewTrunk;
          Pgno iNewTrunk = get4byte(&pTrunk->aData[8]);
          if( iNewTrunk>mxPage ){
            rc = SQLITE_CORRUPT_PGNO(iTrunk);
            goto end_allocate_page;
          }
          testcase( iNewTrunk==mxPage );
          rc = btreeGetUnusedPage(pBt, iNewTrunk, &pNewTrunk, 0);
          if( rc!=SQLITE_OK ){
            goto end_allocate_page;
          }
          rc = sqlite3PagerWrite(pNewTrunk->pDbPage);
          if( rc!=SQLITE_OK ){
            releasePage(pNewTrunk);
            goto end_allocate_page;
          }
          memcpy(&pNewTrunk->aData[0], &pTrunk->aData[0], 4);
          put4byte(&pNewTrunk->aData[4], k-1);
          memcpy(&pNewTrunk->aData[8], &pTrunk->aData[12], (k-1)*4);
          releasePage(pNewTrunk);
          if( !pPrevTrunk ){
            assert( sqlite3PagerIswriteable(pPage1->pDbPage) );
            put4byte(&pPage1->aData[32], iNewTrunk);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc ){
              goto end_allocate_page;
            }
            put4byte(&pPrevTrunk->aData[0], iNewTrunk);
          }
        }
        pTrunk = 0;
        TRACE(("ALLOCATE: %u trunk - %u free pages left\n", *pPgno, n-1));
#endif
      }else if( k>0 ){
        /* Extract a leaf from the trunk */
        u32 closest;
        Pgno iPage;
        unsigned char *aData = pTrunk->aData;
        if( nearby>0 ){
          u32 i;
          closest = 0;
          if( eMode==BTALLOC_LE ){
            for(i=0; i<k; i++){
              iPage = get4byte(&aData[8+i*4]);
              if( iPage<=nearby ){
                closest = i;
                break;
              }
            }
          }else{
            int dist;
            dist = sqlite3AbsInt32(get4byte(&aData[8]) - nearby);
            for(i=1; i<k; i++){
              int d2 = sqlite3AbsInt32(get4byte(&aData[8+i*4]) - nearby);
              if( d2<dist ){
                closest = i;
                dist = d2;
              }
            }
          }
        }else{
          closest = 0;
        }

        iPage = get4byte(&aData[8+closest*4]);
        testcase( iPage==mxPage );
        if( iPage>mxPage || iPage<2 ){
          rc = SQLITE_CORRUPT_PGNO(iTrunk);
          goto end_allocate_page;
        }
        testcase( iPage==mxPage );
        if( !searchList
         || (iPage==nearby || (iPage<nearby && eMode==BTALLOC_LE))
        ){
          int noContent;
          *pPgno = iPage;
          TRACE(("ALLOCATE: %u was leaf %u of %u on trunk %u"
                 ": %u more free pages\n",
                 *pPgno, closest+1, k, pTrunk->pgno, n-1));
          rc = sqlite3PagerWrite(pTrunk->pDbPage);
          if( rc ) goto end_allocate_page;
          if( closest<k-1 ){
            memcpy(&aData[8+closest*4], &aData[4+k*4], 4);
          }
          put4byte(&aData[4], k-1);
          noContent = !btreeGetHasContent(pBt, *pPgno)? PAGER_GET_NOCONTENT : 0;
          rc = btreeGetUnusedPage(pBt, *pPgno, ppPage, noContent);
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerWrite((*ppPage)->pDbPage);
            if( rc!=SQLITE_OK ){
              releasePage(*ppPage);
              *ppPage = 0;
            }
          }
          searchList = 0;
        }
      }
      releasePage(pPrevTrunk);
      pPrevTrunk = 0;
    }while( searchList );
  }else{
    /* There are no pages on the freelist, so append a new page to the
    ** database image.
    **
    ** Normally, new pages allocated by this block can be requested from the
    ** pager layer with the 'no-content' flag set. This prevents the pager
    ** from trying to read the pages content from disk. However, if the
    ** current transaction has already run one or more incremental-vacuum
    ** steps, then the page we are about to allocate may contain content
    ** that is required in the event of a rollback. In this case, do
    ** not set the no-content flag. This causes the pager to load and journal
    ** the current page content before overwriting it.
    **
    ** Note that the pager will not actually attempt to load or journal
    ** content for any page that really does lie past the end of the database
    ** file on disk. So the effects of disabling the no-content optimization
    ** here are confined to those pages that lie between the end of the
    ** database image and the end of the database file.
    */
    int bNoContent = (0==IfNotOmitAV(pBt->bDoTruncate))? PAGER_GET_NOCONTENT:0;

    rc = sqlite3PagerWrite(pBt->pPage1->pDbPage);
    if( rc ) return rc;
    pBt->nPage++;
    if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ) pBt->nPage++;

#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum && PTRMAP_ISPAGE(pBt, pBt->nPage) ){
      /* If *pPgno refers to a pointer-map page, allocate two new pages
      ** at the end of the file instead of one. The first allocated page
      ** becomes a new pointer-map page, the second is used by the caller.
      */
      MemPage *pPg = 0;
      TRACE(("ALLOCATE: %u from end of file (pointer-map page)\n", pBt->nPage));
      assert( pBt->nPage!=PENDING_BYTE_PAGE(pBt) );
      rc = btreeGetUnusedPage(pBt, pBt->nPage, &pPg, bNoContent);
      if( rc==SQLITE_OK ){
        rc = sqlite3PagerWrite(pPg->pDbPage);
        releasePage(pPg);
      }
      if( rc ) return rc;
      pBt->nPage++;
      if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ){ pBt->nPage++; }
    }
#endif
    put4byte(28 + (u8*)pBt->pPage1->aData, pBt->nPage);
    *pPgno = pBt->nPage;

    assert( *pPgno!=PENDING_BYTE_PAGE(pBt) );
    rc = btreeGetUnusedPage(pBt, *pPgno, ppPage, bNoContent);
    if( rc ) return rc;
    rc = sqlite3PagerWrite((*ppPage)->pDbPage);
    if( rc!=SQLITE_OK ){
      releasePage(*ppPage);
      *ppPage = 0;
    }
    TRACE(("ALLOCATE: %u from end of file\n", *pPgno));
  }

  assert( CORRUPT_DB || *pPgno!=PENDING_BYTE_PAGE(pBt) );

end_allocate_page:
  releasePage(pTrunk);
  releasePage(pPrevTrunk);
  assert( rc!=SQLITE_OK || sqlite3PagerPageRefcount((*ppPage)->pDbPage)<=1 );
  assert( rc!=SQLITE_OK || (*ppPage)->isInit==0 );
  return rc;
}